

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio_category.h
# Opt level: O0

void __thiscall booster::aio::aio_error::category::~category(category *this)

{
  void *in_RDI;
  
  ~category((category *)0x204588);
  operator_delete(in_RDI);
  return;
}

Assistant:

class BOOSTER_API category : public system::error_category {
		public:
			category() {}
			category(category &&) {}
			/// Get category name
			virtual char const *name() const noexcept;
			/// Get message from code
			virtual std::string message(int cat) const;
		}